

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_msg_generator.c
# Opt level: O3

rfc5444_result
rfc5444_writer_create_message
          (rfc5444_writer *writer,uint8_t msgid,uint8_t addr_len,rfc5444_writer_targetselector useIf
          ,void *param)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  list_entity *plVar4;
  list_entity *plVar5;
  list_entity *plVar6;
  ulong uVar7;
  ulong uVar8;
  _Bool _Var9;
  char cVar10;
  rfc5444_result rVar11;
  int iVar12;
  rfc5444_writer_message *prVar13;
  rfc5444_writer_target *prVar14;
  ulong uVar15;
  list_entity *plVar16;
  list_entity *plVar17;
  avl_node *paVar18;
  list_entity *plVar19;
  uint uVar20;
  undefined1 uVar21;
  size_t mtu;
  int *piVar22;
  bool bVar23;
  list_entity **pplVar24;
  int iVar25;
  ulong uVar26;
  ulong uVar27;
  list_entity *plVar28;
  int iVar29;
  rfc5444_writer_message *msg;
  int iVar30;
  rfc5444_writer_address *last_addr;
  ulong uVar31;
  long lVar32;
  list_entity current_list;
  _rfc5444_internal_addr_compress_session acs [16];
  uint8_t local_24d;
  int local_24c;
  rfc5444_writer_targetselector local_248;
  rfc5444_writer_target *local_240;
  rfc5444_writer_address **local_238;
  undefined4 local_22c;
  int local_228;
  int local_224;
  list_entity local_220;
  ulong local_210;
  rfc5444_writer_address *local_208;
  list_entity *local_200;
  uint local_1f4;
  list_entity **local_1f0;
  list_entity *local_1e8;
  rfc5444_writer_message *local_1e0;
  list_entity **local_1d8;
  ulong local_1d0;
  rfc5444_writer_address *local_1c8;
  ulong local_1c0;
  _rfc5444_internal_addr_compress_session local_1b8 [16];
  
  local_24d = msgid;
  local_248 = useIf;
  local_240 = (rfc5444_writer_target *)param;
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_msg_generator.c"
                  ,0x86,
                  "enum rfc5444_result rfc5444_writer_create_message(struct rfc5444_writer *, uint8_t, uint8_t, rfc5444_writer_targetselector, void *)"
                 );
  }
  if (((writer->_targets).next != &writer->_targets) ||
     ((writer->_targets).prev != &writer->_targets)) {
    prVar13 = (rfc5444_writer_message *)avl_find(&writer->_msgcreators,&local_24d);
    if (prVar13 == (rfc5444_writer_message *)0x0) {
      return RFC5444_NO_MSGCREATOR;
    }
    if (prVar13->target_specific == true) {
      prVar14 = local_240;
      if (local_248 != rfc5444_writer_singletarget_selector) {
        plVar17 = (writer->_targets).next;
        if (plVar17->prev == (writer->_targets).prev) {
          return RFC5444_OKAY;
        }
        while( true ) {
          _Var9 = (*local_248)(writer,(rfc5444_writer_target *)(plVar17 + -3),local_240);
          if ((_Var9) &&
             (rVar11 = rfc5444_writer_create_message
                                 (writer,local_24d,addr_len,rfc5444_writer_singletarget_selector,
                                  (rfc5444_writer_target *)(plVar17 + -3)), rVar11 != RFC5444_OKAY))
          break;
          plVar17 = plVar17->next;
          if (plVar17->prev == (writer->_targets).prev) {
            return RFC5444_OKAY;
          }
        }
        return rVar11;
      }
    }
    else {
      prVar14 = (rfc5444_writer_target *)0x0;
    }
    writer->msg_target = prVar14;
    writer->msg_addr_len = addr_len;
    plVar17 = (writer->_processors).list_head.next;
    if (plVar17->prev == (writer->_processors).list_head.prev) {
      lVar32 = 0;
    }
    else {
      lVar32 = 0;
      do {
        cVar10 = (*(code *)plVar17[4].next)(plVar17,prVar13->type);
        if (cVar10 != '\0') {
          lVar32 = lVar32 + (ulong)*(ushort *)((long)&plVar17[3].prev + 4);
        }
        plVar17 = plVar17->next;
      } while (plVar17->prev != (writer->_processors).list_head.prev);
    }
    mtu = writer->msg_size;
    plVar17 = (writer->_targets).next;
    uVar31 = mtu;
    local_1e0 = prVar13;
    if (plVar17->prev != (writer->_targets).prev) {
      do {
        _Var9 = (*local_248)(writer,(rfc5444_writer_target *)(plVar17 + -3),local_240);
        if (_Var9) {
          if (*(char *)&plVar17[1].next == '\x01') {
            _rfc5444_writer_begin_packet(writer,(rfc5444_writer_target *)(plVar17 + -3));
          }
          uVar15 = (long)plVar17[-3].prev -
                   ((long)&(plVar17[2].prev)->next +
                   (long)&(plVar17[3].next)->next + (long)&(plVar17[2].next)->next + lVar32);
          if (uVar15 < uVar31) {
            uVar31 = uVar15;
          }
        }
        plVar17 = plVar17->next;
      } while (plVar17->prev != (writer->_targets).prev);
      mtu = writer->msg_size;
    }
    _rfc5444_tlv_writer_init(&writer->_msg,uVar31,mtu);
    msg = local_1e0;
    writer->_state = RFC5444_WRITER_ADD_HEADER;
    local_1e0->has_origaddr = false;
    local_1e0->has_hoplimit = false;
    local_1e0->has_hopcount = false;
    local_1e0->has_seqno = false;
    (writer->_msg).header = 6;
    if ((local_1e0->addMessageHeader ==
         (_func_int_rfc5444_writer_ptr_rfc5444_writer_message_ptr *)0x0) ||
       (iVar12 = (*local_1e0->addMessageHeader)(writer,local_1e0), iVar12 == 0)) {
      writer->_state = RFC5444_WRITER_ADD_MSGTLV;
      plVar16 = (msg->_provider_tree).list_head.prev;
      for (plVar17 = (msg->_provider_tree).list_head.next; plVar17->prev != plVar16;
          plVar17 = plVar17->next) {
        if (plVar17[-2].prev != (list_entity *)0x0) {
          (*(code *)plVar17[-2].prev)();
          plVar16 = (msg->_provider_tree).list_head.prev;
        }
      }
      writer->_state = RFC5444_WRITER_ADD_ADDRESSES;
      plVar16 = (msg->_provider_tree).list_head.prev;
      for (plVar17 = (msg->_provider_tree).list_head.next; plVar17->prev != plVar16;
          plVar17 = plVar17->next) {
        if (plVar17[-1].next != (list_entity *)0x0) {
          (*(code *)plVar17[-1].next)();
          plVar16 = (msg->_provider_tree).list_head.prev;
        }
      }
      plVar17 = &prVar13->_addr_head;
      plVar19 = &prVar13->_non_mandatory_addr_head;
      plVar16 = (msg->_non_mandatory_addr_head).next;
      if ((plVar16 != plVar19) || ((msg->_non_mandatory_addr_head).prev != plVar19)) {
        ((msg->_addr_head).prev)->next = plVar16;
        ((msg->_non_mandatory_addr_head).next)->prev = (msg->_addr_head).prev;
        plVar16 = (msg->_non_mandatory_addr_head).prev;
        (msg->_addr_head).prev = plVar16;
        plVar16->next = plVar17;
        (msg->_non_mandatory_addr_head).prev = plVar19;
        (msg->_non_mandatory_addr_head).next = plVar19;
      }
      local_220.next = &local_220;
      plVar16 = plVar17->next;
      if (plVar16 == plVar17) {
        local_220.prev = local_220.next;
        if ((msg->_addr_head).prev == plVar17) {
          _finalize_message_fragment(writer,msg,&local_220,true,local_248,local_240);
          writer->_state = RFC5444_WRITER_NONE;
          _rfc5444_writer_free_addresses(writer,msg);
          return RFC5444_OKAY;
        }
      }
      else {
        iVar12 = (int)(writer->_msg).header + (int)(writer->_msg).allocated +
                 (int)(writer->_msg).added;
        local_1c0 = (ulong)(((int)uVar31 - iVar12) + 1);
        local_22c = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar12 >> 8),1);
        local_1f0 = (list_entity **)0x0;
        last_addr = (rfc5444_writer_address *)0x0;
        local_24c = 0;
        local_224 = 0;
        local_228 = 0;
        local_1e8 = plVar17;
        do {
          local_220.next = &local_220;
          bVar23 = true;
          plVar17 = local_1e8;
          local_220.prev = local_220.next;
LAB_0012ea37:
          while ((*(undefined1 *)((long)&plVar16[9].prev + 1) == '\x01' &&
                 (*(char *)&plVar16[9].prev == '\0'))) {
            plVar16 = plVar16->next;
            if (plVar16 == plVar17) goto LAB_0012efa5;
          }
          if (bVar23) {
            for (plVar17 = (msg->_msgspecific_tlvtype_head).next;
                plVar17->prev != (msg->_msgspecific_tlvtype_head).prev; plVar17 = plVar17->next) {
              *(undefined8 *)((long)&plVar17[5].prev + 4) = 0;
              *(undefined8 *)((long)&plVar17[6].next + 4) = 0;
              *(undefined8 *)((long)&plVar17[4].prev + 4) = 0;
              *(undefined8 *)((long)&plVar17[5].next + 4) = 0;
              *(undefined8 *)((long)&plVar17[3].prev + 4) = 0;
              *(undefined8 *)((long)&plVar17[4].next + 4) = 0;
              *(undefined8 *)((long)&plVar17[2].prev + 4) = 0;
              *(undefined8 *)((long)&plVar17[3].next + 4) = 0;
              *(undefined8 *)((long)&plVar17[1].prev + 4) = 0;
              *(undefined8 *)((long)&plVar17[2].next + 4) = 0;
            }
            for (plVar17 = (writer->_addr_tlvtype_head).next;
                plVar17->prev != (writer->_addr_tlvtype_head).prev; plVar17 = plVar17->next) {
              *(undefined8 *)((long)&plVar17[5].prev + 4) = 0;
              *(undefined8 *)((long)&plVar17[6].next + 4) = 0;
              *(undefined8 *)((long)&plVar17[4].prev + 4) = 0;
              *(undefined8 *)((long)&plVar17[5].next + 4) = 0;
              *(undefined8 *)((long)&plVar17[3].prev + 4) = 0;
              *(undefined8 *)((long)&plVar17[4].next + 4) = 0;
              *(undefined8 *)((long)&plVar17[2].prev + 4) = 0;
              *(undefined8 *)((long)&plVar17[3].next + 4) = 0;
              *(undefined8 *)((long)&plVar17[1].prev + 4) = 0;
              *(undefined8 *)((long)&plVar17[2].next + 4) = 0;
            }
            memset(local_1b8,0,0x180);
            local_24c = 1;
            local_1f0 = &plVar16[-2].prev;
          }
          local_1c8 = last_addr;
          *(int *)&plVar16[-2].prev = local_224;
          plVar16[1].next = &local_220;
          plVar16[1].prev = local_220.prev;
          pplVar24 = &(local_220.prev)->next;
          local_220.prev = plVar16 + 1;
          local_208 = (rfc5444_writer_address *)&plVar16[-2].prev;
          *pplVar24 = plVar16 + 1;
          plVar17 = local_220.prev;
          local_200 = local_220.next;
          if (local_220.next == local_220.prev) {
            bVar1 = writer->msg_addr_len;
            local_210 = CONCAT71(local_210._1_7_,bVar1);
            local_238 = (rfc5444_writer_address **)
                        CONCAT71(local_238._1_7_,
                                 (uint)bVar1 * 8 ==
                                 (uint)(byte)*(undefined1 *)((long)&local_220.prev[-2].prev + 5));
            pplVar24 = (list_entity **)0x0;
            local_1d0 = 0;
          }
          else {
            plVar19 = (local_220.prev)->prev;
            bVar1 = writer->msg_addr_len;
            bVar2 = *(undefined1 *)((long)&local_220.prev[-2].prev + 5);
            local_238 = (rfc5444_writer_address **)
                        CONCAT71(local_238._1_7_,(uint)bVar1 * 8 == (uint)bVar2);
            local_24c = local_24c + 1;
            if (*(byte *)((long)&plVar19[-2].prev + 5) != bVar2) {
              local_24c = 1;
            }
            uVar31 = 0;
            if (bVar1 != 0) {
              do {
                if (*(char *)((long)plVar19 + (uVar31 - 0x24)) !=
                    *(char *)((long)local_220.prev + (uVar31 - 0x24))) goto LAB_0012eb82;
                uVar31 = uVar31 + 1;
              } while (bVar1 != uVar31);
              uVar31 = (ulong)bVar1;
            }
LAB_0012eb82:
            pplVar24 = &plVar19[-3].prev;
            _close_addrblock(local_1b8,writer,(rfc5444_writer_address *)pplVar24,(int)uVar31);
            local_1d0 = uVar31 & 0xffffffff;
            local_210 = CONCAT71(local_210._1_7_,bVar1);
          }
          plVar19 = plVar17[4].prev;
          plVar28 = plVar19->prev;
          if (plVar28 != plVar17[5].next) {
            do {
              plVar28 = plVar19[-1].prev;
              *(undefined2 *)&plVar19[5].next = 0;
              if (((local_200 != plVar17) &&
                  (paVar18 = avl_find((avl_tree *)(pplVar24 + 0xe),plVar28 + 2),
                  paVar18 != (avl_node *)0x0)) &&
                 (uVar3 = *(ushort *)&paVar18[1].list.prev, uVar3 == *(ushort *)&plVar19[4].next)) {
                *(undefined1 *)((long)&plVar19[5].next + 1) = 1;
                iVar12 = bcmp(plVar19[4].prev,paVar18[1].parent,(ulong)uVar3);
                *(bool *)&plVar19[5].next = iVar12 == 0;
              }
              plVar19 = plVar19->next;
              plVar28 = plVar19->prev;
            } while (plVar28 != plVar17[5].next);
          }
          last_addr = local_1c8;
          msg = local_1e0;
          if (bVar1 != 0) {
            local_1d8 = &plVar17[-3].prev;
            local_1f4 = (byte)local_238 ^ 3;
            local_238 = &local_1c8 + (local_210 & 0xff) * 3;
            local_210 = (ulong)(uint)bVar1;
            uVar31 = 0;
            do {
              bVar23 = local_1d0 < uVar31 || local_200 == plVar17;
              bVar1 = writer->msg_addr_len;
              iVar12 = 0;
              if (local_1d0 >= uVar31 && local_200 != plVar17) {
                iVar12 = (uint)bVar1 - (int)uVar31;
                if (local_1b8[uVar31].multiplen == true) {
                  iVar12 = iVar12 + 1;
                }
                else if (local_24c == 1) {
                  iVar12 = ((iVar12 + (local_1b8[uVar31].ptr)->index) - *(int *)local_1d8) + 1;
                  local_1b8[uVar31].multiplen = true;
                }
              }
              iVar29 = (3 - (uint)(uVar31 == 0)) + local_1f4 + (uint)bVar1;
              plVar19 = plVar17[4].prev;
              plVar4 = plVar19->prev;
              plVar6 = plVar19;
              plVar5 = plVar4;
              while (plVar5 != plVar28) {
                plVar5 = plVar6[-1].prev;
                iVar30 = 5 - (uint)(*(undefined1 *)((long)&plVar5->next + 1) == '\0');
                uVar3 = *(ushort *)&plVar6[4].next;
                uVar20 = (uint)uVar3;
                iVar25 = (iVar30 - (uint)(uVar3 < 0x100)) + 2;
                if (uVar3 == 0) {
                  iVar25 = iVar30;
                }
                iVar25 = iVar25 + (uint)uVar3;
                if ((bVar23) || (*(undefined1 *)((long)&plVar6[5].next + 1) == '\0')) {
                  iVar12 = iVar12 + iVar25;
                }
                else {
                  if (*(char *)((long)&plVar5[6].next + uVar31 + 4) != '\x01') {
                    if (*(char *)&plVar6[5].next != '\0') goto LAB_0012ed75;
                    uVar20 = (uint)uVar3 * *(int *)((long)&plVar5[2].next + uVar31 * 4 + 4);
                  }
                  iVar12 = iVar12 + uVar20;
                }
LAB_0012ed75:
                iVar29 = iVar29 + iVar25;
                plVar6 = plVar6->next;
                plVar5 = plVar6->prev;
              }
              if ((bVar23) || (*(int *)local_238 + iVar29 < local_1b8[uVar31].total + iVar12)) {
                local_1b8[uVar31].ptr = (rfc5444_writer_address *)local_1d8;
                local_1b8[uVar31].multiplen = false;
                local_1b8[uVar31].total = *(int *)local_238;
                _Var9 = true;
                iVar12 = iVar29;
              }
              else {
                _Var9 = false;
              }
              local_1b8[uVar31].current = iVar12;
              if (local_200 != plVar17) {
                local_1b8[uVar31].closed = _Var9;
              }
              if (plVar4 != plVar28) {
                do {
                  plVar28 = plVar19[-1].prev;
                  if ((_Var9 == false) && (*(undefined1 *)((long)&plVar19[5].next + 1) != '\0')) {
                    piVar22 = (int *)((long)&plVar28[2].next + uVar31 * 4 + 4);
                    *piVar22 = *piVar22 + 1;
                    uVar21 = 1;
                    if (*(char *)&plVar19[5].next == '\0') goto LAB_0012ee1e;
                  }
                  else {
                    *(undefined4 *)((long)&plVar28[2].next + uVar31 * 4 + 4) = 1;
                    uVar21 = 0;
LAB_0012ee1e:
                    *(undefined1 *)((long)&plVar28[6].next + uVar31 + 4) = uVar21;
                  }
                  plVar19 = plVar19->next;
                  plVar28 = plVar19->prev;
                } while (plVar28 != plVar17[5].next);
              }
              uVar31 = uVar31 + 1;
            } while (uVar31 != local_210);
          }
          local_224 = local_224 + 1;
          bVar1 = writer->msg_addr_len;
          uVar31 = (ulong)bVar1;
          if (uVar31 != 0) {
            uVar27 = 0xffffffff;
            piVar22 = &local_1b8[0].current;
            uVar26 = 0;
            uVar15 = local_1c0;
            do {
              uVar7 = (ulong)(uint)(*piVar22 + piVar22[-1]);
              uVar8 = uVar26 & 0xffffffff;
              if ((int)uVar15 <= *piVar22 + piVar22[-1] ||
                  0xfe < (int)(local_208->index -
                              ((_rfc5444_internal_addr_compress_session *)(piVar22 + -3))->ptr->
                              index)) {
                uVar7 = uVar15 & 0xffffffff;
                uVar8 = uVar27;
              }
              uVar27 = uVar8;
              uVar15 = uVar7;
              uVar26 = uVar26 + 1;
              piVar22 = piVar22 + 6;
            } while (uVar31 != uVar26);
            if ((int)uVar27 == -1) goto LAB_0012ef1e;
            if (uVar31 != 0) {
              lVar32 = 0;
              do {
                piVar22 = (int *)((long)&local_1b8[0].total + lVar32);
                *piVar22 = *piVar22 + *(int *)((long)&local_1b8[0].current + lVar32);
                lVar32 = lVar32 + 0x18;
              } while ((ulong)bVar1 * 0x18 != lVar32);
            }
            if (*(undefined1 *)((long)&plVar16[9].prev + 1) == '\0') {
              *(undefined1 *)((long)&plVar16[9].prev + 1) = 1;
              local_228 = local_228 + (*(byte *)&plVar16[9].prev ^ 1);
            }
            plVar16 = plVar16->next;
            bVar23 = false;
            plVar17 = local_1e8;
            last_addr = local_208;
            if (plVar16 == local_1e8) goto LAB_0012efaa;
            goto LAB_0012ea37;
          }
LAB_0012ef1e:
          if (local_228 == 0) {
            writer->_state = RFC5444_WRITER_NONE;
            _rfc5444_writer_free_addresses(writer,local_1e0);
            return RFC5444_MTU_TOO_SMALL;
          }
          plVar17 = plVar16[1].next;
          plVar19 = plVar16[1].prev;
          plVar19->next = plVar17;
          plVar17->prev = plVar19;
          plVar16[1].next = (list_entity *)0x0;
          plVar16[1].prev = (list_entity *)0x0;
          local_22c = 0;
          _close_addrblock(local_1b8,writer,local_1c8,0);
          _finalize_message_fragment(writer,msg,&local_220,false,local_248,local_240);
          plVar16 = (list_entity *)(local_1f0 + 3);
          local_220.next = &local_220;
          local_220.prev = &local_220;
        } while (plVar16 != local_1e8);
LAB_0012efa5:
        if (last_addr != (rfc5444_writer_address *)0x0) {
LAB_0012efaa:
          _close_addrblock(local_1b8,writer,last_addr,0);
          _finalize_message_fragment
                    (writer,msg,&local_220,(_Bool)((byte)local_22c & 1),local_248,local_240);
        }
      }
      _rfc5444_writer_free_addresses(writer,msg);
    }
    writer->_state = RFC5444_WRITER_NONE;
    writer->msg_addr_len = '\0';
  }
  return RFC5444_OKAY;
}

Assistant:

enum rfc5444_result
rfc5444_writer_create_message(
  struct rfc5444_writer *writer, uint8_t msgid, uint8_t addr_len, rfc5444_writer_targetselector useIf, void *param)
{
  struct rfc5444_writer_message *msg;
  struct rfc5444_writer_content_provider *prv;
  struct list_entity *ptr1;
  struct rfc5444_writer_address *addr;
  struct rfc5444_writer_address *first_addr;
  struct rfc5444_writer_address *first_processed, *last_processed;
  struct rfc5444_writer_tlvtype *tlvtype;
  struct rfc5444_writer_target *target;
  struct list_entity current_list;

  struct rfc5444_writer_postprocessor *processor;
  size_t processor_preallocation;

  struct _rfc5444_internal_addr_compress_session acs[RFC5444_MAX_ADDRLEN];
  int best_size, best_head, same_prefixlen;
  int i, idx, non_mandatory;
  bool first;
  bool not_fragmented;
  size_t max_msg_size;
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  /* do nothing if no target is defined */
  if (list_is_empty(&writer->_targets)) {
    return RFC5444_OKAY;
  }

  /* find message create instance for the requested message */
  msg = avl_find_element(&writer->_msgcreators, &msgid, msg, _msgcreator_node);
  if (msg == NULL) {
    /* error, no msgcreator found */
    return RFC5444_NO_MSGCREATOR;
  }

  /*
   * test if we need target specific messages
   * and this is not the single_if selector
   */
  if (!msg->target_specific) {
    /* not target specific */
    writer->msg_target = NULL;
  }
  else if (useIf == rfc5444_writer_singletarget_selector) {
    /* target specific, but single_if selector is used */
    writer->msg_target = param;
  }
  else {
    /* target specific, but generic selector is used */
    enum rfc5444_result result;

    list_for_each_element(&writer->_targets, target, _target_node) {
      /* check if we should send over this target */
      if (!useIf(writer, target, param)) {
        continue;
      }

      /* create an unique message by recursive call */
      result = rfc5444_writer_create_message(writer, msgid, addr_len, rfc5444_writer_singletarget_selector, target);
      if (result != RFC5444_OKAY) {
        return result;
      }
    }
    return RFC5444_OKAY;
  }

  /* set address length */
  writer->msg_addr_len = addr_len;

  /*
   * initialize packet buffers for all interfaces if necessary
   * and calculate message MTU
   */

  /* loop over post-processors */
  processor_preallocation = 0;
  avl_for_each_element(&writer->_processors, processor, _node) {
    if (processor->is_matching_signature(processor, msg->type)) {
      processor_preallocation += processor->allocate_space;
    }
  }
  max_msg_size = writer->msg_size;
  list_for_each_element(&writer->_targets, target, _target_node) {
    size_t interface_msg_mtu;

    /* check if we should send over this target */
    if (!useIf(writer, target, param)) {
      continue;
    }

    /* start packet if necessary */
    if (target->_is_flushed) {
      _rfc5444_writer_begin_packet(writer, target);
    }

    interface_msg_mtu = target->packet_size - processor_preallocation -
                        (target->_pkt.header + target->_pkt.added + target->_pkt.allocated);
    if (interface_msg_mtu < max_msg_size) {
      max_msg_size = interface_msg_mtu;
    }
  }

  /* initialize message tlvdata */
  _rfc5444_tlv_writer_init(&writer->_msg, max_msg_size, writer->msg_size);

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_ADD_HEADER;
#endif
  /* let the message creator write the message header */
  rfc5444_writer_set_msg_header(writer, msg, false, false, false, false);
  if (msg->addMessageHeader) {
    if (msg->addMessageHeader(writer, msg)) {
      /* message handler does not want this message */
#if WRITER_STATE_MACHINE == true
      writer->_state = RFC5444_WRITER_NONE;
#endif
      writer->msg_addr_len = 0;
      return RFC5444_OKAY;
    }
  }

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_ADD_MSGTLV;
#endif

  /* call content providers for message TLVs */
  avl_for_each_element(&msg->_provider_tree, prv, _provider_node) {
    if (prv->addMessageTLVs) {
      prv->addMessageTLVs(writer);
    }
  }

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_ADD_ADDRESSES;
#endif
  /* call content providers for addresses */
  avl_for_each_element(&msg->_provider_tree, prv, _provider_node) {
    if (prv->addAddresses) {
      prv->addAddresses(writer);
    }
  }

  /* join mandatory and normal address list */
  list_merge(&msg->_addr_head, &msg->_non_mandatory_addr_head);

  /* initialize list of current addresses */
  list_init_head(&current_list);
  not_fragmented = true;

  /* no addresses ? */
  if (list_is_empty(&msg->_addr_head)) {
    _finalize_message_fragment(writer, msg, &current_list, true, useIf, param);
#if WRITER_STATE_MACHINE == true
    writer->_state = RFC5444_WRITER_NONE;
#endif
    _rfc5444_writer_free_addresses(writer, msg);
    return RFC5444_OKAY;
  }

  /* start address compression */
  first = true;
  addr = first_addr = list_first_element(&msg->_addr_head, addr, _addr_list_node);

  same_prefixlen = 0;

  first_processed = NULL;
  last_processed = NULL;

  max_msg_size -= writer->_msg.header;
  max_msg_size -= writer->_msg.allocated;
  max_msg_size -= writer->_msg.added;

  /* loop through addresses */
  idx = 0;
  non_mandatory = 0;
  ptr1 = msg->_addr_head.next;
  while (ptr1 != &msg->_addr_head) {
    addr = container_of(ptr1, struct rfc5444_writer_address, _addr_list_node);
    if (addr->_done && !addr->_mandatory_addr) {
      ptr1 = ptr1->next;
      continue;
    }

    if (first) {
      /* clear message specific tlvtype information for address compression */
      list_for_each_element(&msg->_msgspecific_tlvtype_head, tlvtype, _tlvtype_node) {
        memset(tlvtype->_tlvblock_count, 0, sizeof(tlvtype->_tlvblock_count));
        memset(tlvtype->_tlvblock_multi, 0, sizeof(tlvtype->_tlvblock_multi));
      }

      /* clear generic tlvtype information for address compression */
      list_for_each_element(&writer->_addr_tlvtype_head, tlvtype, _tlvtype_node) {
        memset(tlvtype->_tlvblock_count, 0, sizeof(tlvtype->_tlvblock_count));
        memset(tlvtype->_tlvblock_multi, 0, sizeof(tlvtype->_tlvblock_multi));
      }

      /* clear address compression session */
      memset(acs, 0, sizeof(acs));
      same_prefixlen = 1;

      first_processed = addr;
    }

    addr->index = idx++;
    list_add_tail(&current_list, &addr->_addr_fragment_node);

    /* update session with address */
    same_prefixlen = _compress_address(acs, writer, &current_list, same_prefixlen);
    first = false;

    /* look for best current compression */
    best_head = -1;
    best_size = max_msg_size + 1;
    for (i = 0; i < writer->msg_addr_len; i++) {
      int size = acs[i].total + acs[i].current;
      int count = addr->index - acs[i].ptr->index;

      /* a block of 255 addresses have an index difference of 254 */
      if (size < best_size && count <= 254) {
        best_head = i;
        best_size = size;
      }
    }

    /* fragmentation necessary ? */
    if (best_head == -1) {
      if (non_mandatory == 0) {
        /* the mandatory addresses plus one non-mandatory do not fit into a block! */
#if WRITER_STATE_MACHINE == true
        writer->_state = RFC5444_WRITER_NONE;
#endif
        _rfc5444_writer_free_addresses(writer, msg);
        return RFC5444_MTU_TOO_SMALL;
      }
      not_fragmented = false;

      /* one address too many */
      list_remove(&addr->_addr_fragment_node);

      _close_addrblock(acs, writer, last_processed, 0);
#ifdef DEBUG_OUTPUT
      printf("Finalize with head length: %d\n", last_processed->_block_headlen);
#endif
      /* write message fragment */
      _finalize_message_fragment(writer, msg, &current_list, not_fragmented, useIf, param);

      /* reset loop */
      list_init_head(&current_list);
      ptr1 = &first_processed->_addr_list_node;
      first = true;

      /* continue without stepping forward */
      continue;
    }
    else {
      /* add cost for this address to total costs */
      for (i = 0; i < writer->msg_addr_len; i++) {
        acs[i].total += acs[i].current;

#if DEBUG_CLEANUP == true
        acs[i].current = 0;
#endif
      }
      last_processed = addr;

      if (!addr->_done) {
        addr->_done = true;

        if (!addr->_mandatory_addr) {
          non_mandatory++;
        }
      }
    }

    ptr1 = ptr1->next;
  }

  if (last_processed) {
    _close_addrblock(acs, writer, last_processed, 0);

    /* write message fragment */
    _finalize_message_fragment(writer, msg, &current_list, not_fragmented, useIf, param);
  }

  /* free storage of addresses and address-tlvs */
  _rfc5444_writer_free_addresses(writer, msg);

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_NONE;
#endif
  writer->msg_addr_len = 0;

  return RFC5444_OKAY;
}